

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::WriteAllTarget
          (cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators,
          string *all_target)

{
  pointer *pppcVar1;
  _Rb_tree_header *p_Var2;
  pointer ppcVar3;
  pointer pcVar4;
  iterator __position;
  pointer pcVar5;
  cmGlobalGhsMultiGenerator *this_00;
  cmLocalGenerator *pcVar6;
  bool bVar7;
  TargetType TVar8;
  long *plVar9;
  string *psVar10;
  _Base_ptr p_Var11;
  char *val;
  size_type *psVar12;
  _Alloc_hider *p_Var13;
  cmGeneratorTarget *pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  cmGlobalGhsMultiGenerator *this_01;
  char *__end;
  pointer ppcVar16;
  cmGeneratorTarget *t;
  string fname;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> defaultTargets;
  cmGeneratorTarget *t_1;
  TargetDependSet originalTargets;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  TargetDependSet projectTargets;
  OrderedTargetDependSet sortedProjectTargets;
  cmGeneratedFileStream fbld;
  undefined1 local_3f0 [32];
  string local_3d0;
  cmLocalGenerator *local_3b0;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_3a8;
  cmGeneratorTarget *local_388;
  long local_380;
  undefined1 local_378 [24];
  cmGlobalGenerator *local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_338;
  undefined1 local_318 [56];
  string local_2e0;
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  _Base_ptr p_Stack_260;
  
  ppcVar3 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ProjectTargets).
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar3) {
    (this->ProjectTargets).
    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar3;
  }
  local_318._48_8_ = generators;
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_3d0,root);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_378._16_8_ = &local_358;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar15) {
    local_358._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_358._8_8_ = plVar9[3];
  }
  else {
    local_358._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_378._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar9;
  }
  local_360 = (cmGlobalGenerator *)plVar9[1];
  *plVar9 = (long)paVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x17])(this);
  plVar9 = (long *)std::__cxx11::string::append(local_378 + 0x10);
  p_Var11 = (_Base_ptr)(plVar9 + 2);
  if ((_Base_ptr)*plVar9 == p_Var11) {
    local_318._16_8_ = *(undefined8 *)p_Var11;
    local_318._24_8_ = plVar9[3];
    local_318._0_8_ = (_Base_ptr)(local_318 + 0x10);
  }
  else {
    local_318._16_8_ = *(undefined8 *)p_Var11;
    local_318._0_8_ = (_Base_ptr)*plVar9;
  }
  local_318._8_8_ = plVar9[1];
  *plVar9 = (long)p_Var11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_318);
  paVar15 = &local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
             _M_key_compare.First.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
    _M_key_compare.First.field_2._M_allocated_capacity = *psVar12;
    local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
    _M_key_compare.First.field_2._8_8_ = plVar9[3];
    local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
    _M_key_compare.First._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
    _M_key_compare.First.field_2._M_allocated_capacity = *psVar12;
    local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
    _M_key_compare.First._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
  _M_key_compare.First._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_3b0 = root;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  p_Var13 = (_Alloc_hider *)(plVar9 + 2);
  if ((_Alloc_hider *)*plVar9 == p_Var13) {
    local_268._M_p = p_Var13->_M_p;
    p_Stack_260 = (_Base_ptr)plVar9[3];
    local_278._M_allocated_capacity = (size_type)&local_268;
  }
  else {
    local_268._M_p = p_Var13->_M_p;
    local_278._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar9;
  }
  local_278._8_8_ = plVar9[1];
  *plVar9 = (long)p_Var13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)all_target,(string *)local_278._M_local_buf);
  if ((_Alloc_hider *)local_278._M_allocated_capacity != &local_268) {
    operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
         _M_key_compare.First._M_dataplus._M_p != paVar15) {
    operator_delete(local_2c0._M_impl.
                    super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
                    _M_key_compare.First._M_dataplus._M_p,
                    local_2c0._M_impl.
                    super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
                    _M_key_compare.First.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr)local_318._0_8_ != (_Base_ptr)(local_318 + 0x10)) {
    operator_delete((void *)local_318._0_8_,(ulong)((long)(_Rb_tree_color *)local_318._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._16_8_ != &local_358) {
    operator_delete((void *)local_378._16_8_,local_358._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_3b0);
  pcVar4 = (psVar10->_M_dataplus)._M_p;
  local_278._M_allocated_capacity = (size_type)&local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar4,pcVar4 + psVar10->_M_string_length);
  std::__cxx11::string::append(local_278._M_local_buf);
  plVar9 = (long *)std::__cxx11::string::_M_append
                             (local_278._M_local_buf,(ulong)(all_target->_M_dataplus)._M_p);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_3d0.field_2._M_allocated_capacity = *psVar12;
    local_3d0.field_2._8_8_ = plVar9[3];
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  }
  else {
    local_3d0.field_2._M_allocated_capacity = *psVar12;
    local_3d0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_3d0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((_Alloc_hider *)local_278._M_allocated_capacity != &local_268) {
    operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268._M_p + 1));
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&local_278,&local_3d0,false,None);
  pcVar6 = local_3b0;
  paVar15 = &local_278;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)paVar15,true);
  WriteFileHeader((cmGlobalGhsMultiGenerator *)paVar15,(ostream *)&local_278);
  GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)&local_278);
  local_318._24_8_ = local_318 + 8;
  local_318._8_8_ = local_318._8_8_ & 0xffffffff00000000;
  local_318._16_8_ = (_Base_ptr)0x0;
  local_318._40_8_ = 0;
  local_358._8_8_ = &local_360;
  local_360 = (cmGlobalGenerator *)((ulong)local_360 & 0xffffffff00000000);
  local_358._M_allocated_capacity = 0;
  local_348._8_8_ = 0;
  local_348._M_allocated_capacity = local_358._8_8_;
  local_318._32_8_ = local_318._24_8_;
  cmGlobalGenerator::GetTargetSets
            (&this->super_cmGlobalGenerator,(TargetDependSet *)local_318,
             (TargetDependSet *)(local_378 + 0x10),pcVar6,(GeneratorVector *)local_318._48_8_);
  local_3f0._0_8_ = (cmGeneratorTarget *)(local_3f0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"");
  OrderedTargetDependSet::OrderedTargetDependSet
            ((OrderedTargetDependSet *)&local_2c0,(TargetDependSet *)local_318,(string *)local_3f0);
  if ((cmGeneratorTarget *)local_3f0._0_8_ != (cmGeneratorTarget *)(local_3f0 + 0x10)) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  local_3a8.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmGeneratorTarget **)0x0;
  local_3a8.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (cmGeneratorTarget **)0x0;
  p_Var2 = &local_2c0._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var11 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_3f0._0_8_ = *(undefined8 *)(p_Var11 + 1);
      __position._M_current =
           (this->ProjectTargets).
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ProjectTargets).
          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
        _M_realloc_insert<cmGeneratorTarget_const*const&>
                  ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                   &this->ProjectTargets,__position,(cmGeneratorTarget **)local_3f0);
      }
      else {
        *__position._M_current = (cmGeneratorTarget *)local_3f0._0_8_;
        pppcVar1 = &(this->ProjectTargets).
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var2);
  }
  if ((_Rb_tree_header *)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var11 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_388 = *(cmGeneratorTarget **)(p_Var11 + 1);
      TVar8 = cmGeneratorTarget::GetType(local_388);
      pcVar14 = local_388;
      if (TVar8 != INTERFACE_LIBRARY) {
        local_3f0._0_8_ = local_3f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"EXCLUDE_FROM_ALL","");
        val = cmGeneratorTarget::GetProperty(pcVar14,(string *)local_3f0);
        bVar7 = cmSystemTools::IsOn(val);
        if ((cmGeneratorTarget *)local_3f0._0_8_ != (cmGeneratorTarget *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        if (!bVar7) {
          if (local_3a8.
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_3a8.
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       &local_3a8,
                       (iterator)
                       local_3a8.
                       super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_388);
          }
          else {
            *local_3a8.
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_388;
            local_3a8.
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_3a8.
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var2);
  }
  local_338.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = ComputeTargetBuildOrder(this,&local_3a8,&local_338);
  pcVar6 = local_3b0;
  pcVar4 = local_3f0 + 0x10;
  if (bVar7) {
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_2e0,local_3b0);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,0x4fa0f8);
    pcVar14 = (cmGeneratorTarget *)(plVar9 + 2);
    if ((cmGeneratorTarget *)*plVar9 == pcVar14) {
      local_378._0_8_ = pcVar14->Target;
      local_378._8_8_ = plVar9[3];
      local_388 = (cmGeneratorTarget *)local_378;
    }
    else {
      local_378._0_8_ = pcVar14->Target;
      local_388 = (cmGeneratorTarget *)*plVar9;
    }
    local_380 = plVar9[1];
    *plVar9 = (long)pcVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_388);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar12) {
      local_3f0._16_8_ = *psVar12;
      local_3f0._24_8_ = plVar9[3];
      local_3f0._0_8_ = pcVar4;
    }
    else {
      local_3f0._16_8_ = *psVar12;
      local_3f0._0_8_ = (size_type *)*plVar9;
    }
    local_3f0._8_8_ = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_388 != (cmGeneratorTarget *)local_378) {
      operator_delete(local_388,
                      (ulong)((long)&(((unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        *)local_378._0_8_)->_M_t).
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                             + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::Error((string *)local_3f0);
    if ((pointer)local_3f0._0_8_ != pcVar4) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
  }
  else {
    psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_3b0);
    pcVar5 = (psVar10->_M_dataplus)._M_p;
    local_3f0._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f0,pcVar5,pcVar5 + psVar10->_M_string_length);
    std::__cxx11::string::append(local_3f0);
    ppcVar3 = local_338.
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_338.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_338.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar16 = local_338.
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = (cmGlobalGhsMultiGenerator *)*ppcVar16;
        TVar8 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
        if (((TVar8 != INTERFACE_LIBRARY) &&
            (TVar8 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00),
            TVar8 != MODULE_LIBRARY)) &&
           (this_01 = this_00, TVar8 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00),
           TVar8 != SHARED_LIBRARY)) {
          WriteProjectLine(this_01,(ostream *)&local_278,(cmGeneratorTarget *)this_00,pcVar6,
                           (string *)local_3f0);
        }
        ppcVar16 = ppcVar16 + 1;
      } while (ppcVar16 != ppcVar3);
    }
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
  }
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)&local_278);
  if (local_338.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a8.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
  ::~_Rb_tree((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               *)(local_378 + 0x10));
  std::
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
  ::~_Rb_tree((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               *)local_318);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteAllTarget(
  cmLocalGenerator* root, std::vector<cmLocalGenerator*>& generators,
  std::string& all_target)
{
  this->ProjectTargets.clear();

  // create target build file
  all_target = root->GetProjectName() + "." + this->GetAllTargetName() +
    ".tgt" + FILE_EXTENSION;
  std::string fname =
    root->GetCurrentBinaryDirectory() + "/CMakeFiles/" + all_target;
  cmGeneratedFileStream fbld(fname);
  fbld.SetCopyIfDifferent(true);
  this->WriteFileHeader(fbld);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);

  // Collect all targets under this root generator and the transitive
  // closure of their dependencies.
  TargetDependSet projectTargets;
  TargetDependSet originalTargets;
  this->GetTargetSets(projectTargets, originalTargets, root, generators);
  OrderedTargetDependSet sortedProjectTargets(projectTargets, "");
  std::vector<cmGeneratorTarget const*> defaultTargets;
  for (cmGeneratorTarget const* t : sortedProjectTargets) {
    /* save list of all targets in sorted order */
    this->ProjectTargets.push_back(t);
  }
  for (cmGeneratorTarget const* t : sortedProjectTargets) {
    if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (!cmSystemTools::IsOn(t->GetProperty("EXCLUDE_FROM_ALL"))) {
      defaultTargets.push_back(t);
    }
  }
  std::vector<cmGeneratorTarget const*> build;
  if (ComputeTargetBuildOrder(defaultTargets, build)) {
    std::string message = "The inter-target dependency graph for project [" +
      root->GetProjectName() + "] had a cycle.\n";
    cmSystemTools::Error(message);
  } else {
    // determine the targets for ALL target
    std::string rootBinaryDir = root->GetCurrentBinaryDirectory();
    rootBinaryDir += "/CMakeFiles";
    for (cmGeneratorTarget const* target : build) {
      if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          target->GetType() == cmStateEnums::MODULE_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        continue;
      }
      this->WriteProjectLine(fbld, target, root, rootBinaryDir);
    }
  }
  fbld.Close();
}